

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

PaintContext * __thiscall
QWidgetTextControl::getPaintContext
          (PaintContext *__return_storage_ptr__,QWidgetTextControl *this,QWidget *widget)

{
  QPalette *this_00;
  QList<QAbstractTextDocumentLayout::Selection> *this_01;
  long lVar1;
  ColorRole CVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QStyleSheetStyle *this_02;
  QStyle *pQVar7;
  QBrush *pQVar8;
  QMetaType QVar9;
  long lVar10;
  undefined8 *puVar11;
  PaintContext *pPVar12;
  QTextFormat *pQVar13;
  long in_FS_OFFSET;
  QStyleHintReturnVariant ret;
  QStyleOption option;
  QMetaType local_e8;
  undefined1 *puStack_e0;
  QMetaType local_d8 [2];
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [24];
  undefined1 local_a8 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_a0;
  undefined1 *local_88;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 auStack_50 [16];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  puVar11 = &DAT_006e2d98;
  pPVar12 = __return_storage_ptr__;
  for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
    *(undefined8 *)pPVar12 = *puVar11;
    puVar11 = puVar11 + 1;
    pPVar12 = (PaintContext *)&pPVar12->palette;
  }
  __return_storage_ptr__->cursorPosition = -1;
  this_00 = &__return_storage_ptr__->palette;
  QPalette::QPalette(this_00);
  (__return_storage_ptr__->selections).d.d = (Data *)0x0;
  (__return_storage_ptr__->selections).d.ptr = (Selection *)0x0;
  (__return_storage_ptr__->clip).w = 0.0;
  (__return_storage_ptr__->clip).h = 0.0;
  (__return_storage_ptr__->clip).xp = 0.0;
  (__return_storage_ptr__->clip).yp = 0.0;
  (__return_storage_ptr__->selections).d.size = 0;
  this_01 = &__return_storage_ptr__->selections;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::operator=
            (&this_01->d,
             (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)(lVar1 + 0x120));
  QPalette::operator=(this_00,(QPalette *)(lVar1 + 0x138));
  if (widget != (QWidget *)0x0) {
    QWidget::style(widget);
    this_02 = (QStyleSheetStyle *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
    if (this_02 != (QStyleSheetStyle *)0x0) {
      auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption((QStyleOption *)&local_78,1,0);
      QStyleOption::initFrom((QStyleOption *)&local_78,widget);
      QStyleSheetStyle::styleSheetPalette(this_02,widget,(QStyleOption *)&local_78,this_00);
      QStyleOption::~QStyleOption((QStyleOption *)&local_78);
    }
  }
  if ((*(char *)(lVar1 + 0x80) == '\x01') && (*(char *)(lVar1 + 0x149) == '\x01')) {
    iVar5 = -1;
    if (*(char *)(lVar1 + 0x118) == '\0') {
      if (*(int *)(lVar1 + 0x114) == 0) {
        iVar5 = QTextCursor::position();
      }
      else {
        iVar5 = -2 - *(int *)(lVar1 + 0x114);
      }
    }
    __return_storage_ptr__->cursorPosition = iVar5;
  }
  cVar3 = QTextCursor::isNull();
  if (cVar3 == '\0') {
    iVar5 = QTextCursor::position();
    __return_storage_ptr__->cursorPosition = iVar5;
  }
  cVar3 = QTextCursor::hasSelection();
  if (cVar3 != '\0') {
    auStack_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    auStack_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)local_c8);
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)auStack_c0);
    QTextCursor::operator=((QTextCursor *)local_c8,(QTextCursor *)(lVar1 + 0x88));
    if (*(char *)(lVar1 + 0x90) == '\x01') {
      auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption((QStyleOption *)&local_78,1,0);
      QPalette::operator=((QPalette *)auStack_50,this_00);
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      aStack_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      aStack_a0._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      aStack_a0.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QStyleHintReturnVariant::QStyleHintReturnVariant((QStyleHintReturnVariant *)local_a8);
      pQVar7 = QApplication::style();
      if (widget != (QWidget *)0x0) {
        pQVar7 = QWidget::style(widget);
      }
      (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x4d,&local_78,widget,local_a8);
      pQVar13 = (QTextFormat *)(local_a8 + 8);
      local_d8[0].d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QTextFormat>::metaType;
      local_e8.d_ptr = (QMetaTypeInterface *)((ulong)local_88 & 0xfffffffffffffffc);
      bVar4 = comparesEqual(&local_e8,local_d8);
      if (bVar4) {
        if (((ulong)local_88 & 1) != 0) {
          pQVar13 = (QTextFormat *)(aStack_a0.shared + *(int *)(aStack_a0.shared + 4));
        }
        QTextFormat::QTextFormat((QTextFormat *)&local_e8,pQVar13);
      }
      else {
        local_e8.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
        QTextFormat::QTextFormat((QTextFormat *)&local_e8);
        QVar9.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)local_88 & 1) != 0) {
          pQVar13 = (QTextFormat *)(aStack_a0.shared + *(int *)(aStack_a0.shared + 4));
        }
        QMetaType::convert(QVar9,pQVar13,local_d8[0],&local_e8);
      }
      QTextFormat::toCharFormat();
      QTextFormat::operator=((QTextFormat *)auStack_c0,(QTextFormat *)local_d8);
      QTextFormat::~QTextFormat((QTextFormat *)local_d8);
      QTextFormat::~QTextFormat((QTextFormat *)&local_e8);
      QStyleHintReturnVariant::~QStyleHintReturnVariant((QStyleHintReturnVariant *)local_a8);
    }
    else {
      CVar2 = (*(byte *)(lVar1 + 0x148) ^ 1) * 2;
      pQVar8 = (QBrush *)QPalette::brush((ColorGroup)this_00,CVar2);
      QBrush::operator_cast_to_QVariant((QVariant *)&local_78,pQVar8);
      iVar5 = (int)auStack_c0;
      QTextFormat::setProperty(iVar5,(QVariant *)0x820);
      ::QVariant::~QVariant((QVariant *)&local_78);
      pQVar8 = (QBrush *)QPalette::brush((ColorGroup)this_00,CVar2);
      QBrush::operator_cast_to_QVariant((QVariant *)&local_78,pQVar8);
      QTextFormat::setProperty(iVar5,(QVariant *)0x821);
      ::QVariant::~QVariant((QVariant *)&local_78);
      auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption((QStyleOption *)&local_78,1,0);
      pQVar7 = QApplication::style();
      if (widget != (QWidget *)0x0) {
        QStyleOption::initFrom((QStyleOption *)&local_78,widget);
        pQVar7 = QWidget::style(widget);
      }
      iVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x1d,&local_78,widget,0);
      if (iVar6 != 0) {
        ::QVariant::QVariant((QVariant *)local_a8,true);
        QTextFormat::setProperty(iVar5,(QVariant *)0x6000);
        ::QVariant::~QVariant((QVariant *)local_a8);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&local_78);
    QtPrivate::QMovableArrayOps<QAbstractTextDocumentLayout::Selection>::
    emplace<QAbstractTextDocumentLayout::Selection_const&>
              ((QMovableArrayOps<QAbstractTextDocumentLayout::Selection> *)this_01,
               (__return_storage_ptr__->selections).d.size,(Selection *)local_c8);
    QList<QAbstractTextDocumentLayout::Selection>::end(this_01);
    QTextFormat::~QTextFormat((QTextFormat *)auStack_c0);
    QTextCursor::~QTextCursor((QTextCursor *)local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractTextDocumentLayout::PaintContext QWidgetTextControl::getPaintContext(QWidget *widget) const
{
    Q_D(const QWidgetTextControl);

    QAbstractTextDocumentLayout::PaintContext ctx;

    ctx.selections = d->extraSelections;
    ctx.palette = d->palette;
#if QT_CONFIG(style_stylesheet)
    if (widget) {
        if (auto cssStyle = qt_styleSheet(widget->style())) {
            QStyleOption option;
            option.initFrom(widget);
            cssStyle->styleSheetPalette(widget, &option, &ctx.palette);
        }
    }
#endif // style_stylesheet
    if (d->cursorOn && d->isEnabled) {
        if (d->hideCursor)
            ctx.cursorPosition = -1;
        else if (d->preeditCursor != 0)
            ctx.cursorPosition = - (d->preeditCursor + 2);
        else
            ctx.cursorPosition = d->cursor.position();
    }

    if (!d->dndFeedbackCursor.isNull())
        ctx.cursorPosition = d->dndFeedbackCursor.position();
#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled() || d->hasEditFocus)
#endif
    if (d->cursor.hasSelection()) {
        QAbstractTextDocumentLayout::Selection selection;
        selection.cursor = d->cursor;
        if (d->cursorIsFocusIndicator) {
            QStyleOption opt;
            opt.palette = ctx.palette;
            QStyleHintReturnVariant ret;
            QStyle *style = QApplication::style();
            if (widget)
                style = widget->style();
            style->styleHint(QStyle::SH_TextControl_FocusIndicatorTextCharFormat, &opt, widget, &ret);
            selection.format = qvariant_cast<QTextFormat>(ret.variant).toCharFormat();
        } else {
            QPalette::ColorGroup cg = d->hasFocus ? QPalette::Active : QPalette::Inactive;
            selection.format.setBackground(ctx.palette.brush(cg, QPalette::Highlight));
            selection.format.setForeground(ctx.palette.brush(cg, QPalette::HighlightedText));
            QStyleOption opt;
            QStyle *style = QApplication::style();
            if (widget) {
                opt.initFrom(widget);
                style = widget->style();
            }
            if (style->styleHint(QStyle::SH_RichText_FullWidthSelection, &opt, widget))
                selection.format.setProperty(QTextFormat::FullWidthSelection, true);
        }
        ctx.selections.append(selection);
    }

    return ctx;
}